

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O3

string * cmCurlSetCAInfo(string *__return_storage_ptr__,CURL *curl,string *cafile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  CURLcode CVar3;
  string env_ca;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (cafile->_M_string_length == 0) {
    bVar2 = cmsys::SystemTools::GetEnv("SSL_CERT_FILE",&local_70);
    if ((bVar2) && (bVar2 = cmsys::SystemTools::FileExists(&local_70,true), bVar2)) {
      CVar3 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAINFO,local_70._M_dataplus._M_p);
      if ((CVar3 & ~CURLE_NOT_BUILT_IN) != CURLE_OK) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        curl_easy_strerror(CVar3);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    else {
      bVar2 = cmsys::SystemTools::GetEnv("SSL_CERT_DIR",&local_70);
      if ((bVar2) && (bVar2 = cmsys::SystemTools::FileIsDirectory(&local_70), bVar2)) {
        CVar3 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAPATH,local_70._M_dataplus._M_p);
        if ((CVar3 & ~CURLE_NOT_BUILT_IN) != CURLE_OK) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else {
        bVar2 = cmsys::SystemTools::FileExists("/etc/pki/tls/certs/ca-bundle.crt",true);
        if (bVar2) {
          CVar3 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAINFO,
                                   "/etc/pki/tls/certs/ca-bundle.crt");
          if ((CVar3 & ~CURLE_NOT_BUILT_IN) != CURLE_OK) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            curl_easy_strerror(CVar3);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          bVar2 = cmsys::SystemTools::FileExists("/etc/ssl/certs/ca-certificates.crt",true);
          if ((bVar2) &&
             (CVar3 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAINFO,
                                       "/etc/ssl/certs/ca-certificates.crt"),
             (CVar3 & ~CURLE_NOT_BUILT_IN) != CURLE_OK)) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            curl_easy_strerror(CVar3);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/etc/ssl/certs","");
          bVar2 = cmsys::SystemTools::FileIsDirectory(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((bVar2) &&
             (CVar3 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAPATH,"/etc/ssl/certs"),
             (CVar3 & ~CURLE_NOT_BUILT_IN) != CURLE_OK)) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            curl_easy_strerror(CVar3);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
      }
    }
  }
  else {
    CVar3 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAINFO,(cafile->_M_dataplus)._M_p);
    if ((CVar3 & ~CURLE_NOT_BUILT_IN) != CURLE_OK) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      curl_easy_strerror(CVar3);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCurlSetCAInfo(::CURL* curl, const std::string& cafile)
{
  std::string e;
  std::string env_ca;
  if (!cafile.empty()) {
    ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_CAINFO, cafile.c_str());
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
  }
  /* Honor the user-configurable OpenSSL environment variables. */
  else if (cmSystemTools::GetEnv("SSL_CERT_FILE", env_ca) &&
           cmSystemTools::FileExists(env_ca, true)) {
    ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_CAINFO, env_ca.c_str());
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
  } else if (cmSystemTools::GetEnv("SSL_CERT_DIR", env_ca) &&
             cmSystemTools::FileIsDirectory(env_ca)) {
    ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_CAPATH, env_ca.c_str());
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
  }
#ifdef CMAKE_FIND_CAFILE
#  define CMAKE_CAFILE_FEDORA "/etc/pki/tls/certs/ca-bundle.crt"
  else if (cmSystemTools::FileExists(CMAKE_CAFILE_FEDORA, true)) {
    ::CURLcode res =
      ::curl_easy_setopt(curl, CURLOPT_CAINFO, CMAKE_CAFILE_FEDORA);
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
  }
#  undef CMAKE_CAFILE_FEDORA
  else {
#  define CMAKE_CAFILE_COMMON "/etc/ssl/certs/ca-certificates.crt"
    if (cmSystemTools::FileExists(CMAKE_CAFILE_COMMON, true)) {
      ::CURLcode res =
        ::curl_easy_setopt(curl, CURLOPT_CAINFO, CMAKE_CAFILE_COMMON);
      check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
    }
#  undef CMAKE_CAFILE_COMMON
#  define CMAKE_CAPATH_COMMON "/etc/ssl/certs"
    if (cmSystemTools::FileIsDirectory(CMAKE_CAPATH_COMMON)) {
      ::CURLcode res =
        ::curl_easy_setopt(curl, CURLOPT_CAPATH, CMAKE_CAPATH_COMMON);
      check_curl_result(res, "Unable to set TLS/SSL Verify CAPATH: ");
    }
#  undef CMAKE_CAPATH_COMMON
  }
#endif
  return e;
}